

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.h
# Opt level: O1

void __thiscall OpenCLEnum::Device::~Device(Device *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->version)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->version).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->vendor)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->vendor).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Device()
		{
			device_type			= 0;
			compute_units		= 0;
			mem_size			= 0;
			clock				= 0;
			nvidia_pci_bus_id	= 0;
			nvidia_pci_slot_id	= 0;
			has_cl_khr_spir		= false;
		}